

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_parse(REF_DBL *metric,REF_GRID ref_grid,int narg,char **args)

{
  REF_NODE pRVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  REF_DBL *pRVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double in_XMM1_Qa;
  double dVar18;
  double dVar19;
  double dVar20;
  double local_110;
  double local_108;
  undefined8 uStack_100;
  REF_DBL geom [8];
  double local_a8;
  double local_a0;
  double local_98;
  REF_DBL local_48;
  REF_DBL RStack_40;
  
  local_48 = 0.0;
  RStack_40 = 1.0;
  dVar14 = local_110;
  iVar10 = 0;
LAB_00192929:
  do {
    iVar9 = iVar10;
    local_110 = dVar14;
    if (narg <= iVar9) {
      return 0;
    }
    iVar2 = strncmp(args[iVar9],"--uniform",9);
    iVar10 = iVar9 + 1;
    dVar14 = local_110;
  } while (narg <= iVar10 || iVar2 != 0);
  pcVar8 = args[iVar10];
  if (*pcVar8 == 'c') {
    if ((pcVar8[1] != 'y') || (pcVar8[2] != 'l')) goto LAB_00192929;
    if (iVar9 + 0xc < narg) {
      pcVar8 = args[(long)iVar9 + 2];
      iVar2 = strncmp(pcVar8,"ceil",4);
      if ((iVar2 != 0) && (iVar10 = strncmp(pcVar8,"floor",5), iVar10 != 0)) {
        pcVar8 = 
        "ceil or floor is missing\n  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 x2 y2 z2 r1 r2"
        ;
        uVar5 = 0xd5e;
        goto LAB_0019315f;
      }
      dVar14 = atof(args[(long)iVar9 + 3]);
      dVar15 = atof(args[(long)iVar9 + 4]);
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
        dVar16 = atof(args[(iVar9 + 5) + lVar6]);
        geom[lVar6] = dVar16;
      }
      dVar16 = (double)(~-(ulong)(0.0 < dVar14) & (ulong)-dVar14 |
                       -(ulong)(0.0 < dVar14) & (ulong)dVar14);
      local_108 = dVar15 * 1e+20;
      if (local_108 <= -local_108) {
        local_108 = -local_108;
      }
      uStack_100 = 0;
      lVar6 = 0;
      pRVar7 = metric;
      for (lVar11 = 0; pRVar1 = ref_grid->node, dVar14 = local_110, iVar10 = iVar9 + 0xd,
          lVar11 < pRVar1->max; lVar11 = lVar11 + 1) {
        if (-1 < pRVar1->global[lVar11]) {
          uVar3 = ref_metric_truncated_cone_dist
                            (geom,(REF_DBL *)((long)pRVar1->real + lVar6),&local_110);
          in_XMM1_Qa = local_110;
          if (uVar3 != 0) {
            pcVar8 = "trunc cone dist";
            uVar5 = 0xd6d;
LAB_001930b4:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,uVar5,"ref_metric_parse",(ulong)uVar3,pcVar8);
            return uVar3;
          }
          dVar18 = -local_110;
          dVar14 = dVar18;
          if (dVar18 <= local_110) {
            dVar14 = local_110;
          }
          dVar17 = dVar16;
          if (dVar14 < local_108) {
            dVar17 = exp2(dVar18 / dVar15);
            dVar17 = dVar17 * dVar16;
          }
          uVar3 = ref_matrix_diag_m(pRVar7,&local_a8);
          if (uVar3 != 0) {
            pcVar8 = "decomp";
            uVar5 = 0xd72;
            goto LAB_001930b4;
          }
          dVar14 = 1.0 / (dVar17 * dVar17);
          if (iVar2 == 0) {
            dVar18 = dVar14;
            if (dVar14 <= local_a8) {
              dVar18 = local_a8;
            }
            dVar17 = dVar14;
            if (dVar14 <= local_a0) {
              dVar17 = local_a0;
            }
            local_a8 = dVar18;
            local_a0 = dVar17;
            if (dVar14 <= local_98) {
              dVar14 = local_98;
            }
          }
          else {
            dVar18 = dVar14;
            if (local_a8 <= dVar14) {
              dVar18 = local_a8;
            }
            dVar17 = dVar14;
            if (local_a0 <= dVar14) {
              dVar17 = local_a0;
            }
            local_a8 = dVar18;
            local_a0 = dVar17;
            if (local_98 <= dVar14) {
              dVar14 = local_98;
            }
          }
          local_98 = dVar14;
          uVar3 = ref_matrix_form_m(&local_a8,pRVar7);
          if (uVar3 != 0) {
            pcVar8 = "reform";
            uVar5 = 0xd82;
            goto LAB_001930b4;
          }
          if (ref_grid->twod != 0) {
            pRVar7[2] = 0.0;
            pRVar7[4] = local_48;
            pRVar7[5] = RStack_40;
          }
        }
        pRVar7 = pRVar7 + 6;
        lVar6 = lVar6 + 0x78;
      }
      goto LAB_00192929;
    }
    pcVar8 = 
    "not enough arguments for\n  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 x2 y2 z2 r1 r2"
    ;
    uVar5 = 0xd59;
  }
  else {
    if (((*pcVar8 != 'b') || (pcVar8[1] != 'o')) || (pcVar8[2] != 'x')) goto LAB_00192929;
    if (iVar9 + 10 < narg) {
      pcVar8 = args[(long)iVar9 + 2];
      iVar10 = strncmp(pcVar8,"ceil",4);
      local_108 = (double)CONCAT44(local_108._4_4_,iVar10);
      if ((iVar10 != 0) && (iVar10 = strncmp(pcVar8,"floor",5), iVar10 != 0)) {
        pcVar8 = 
        "ceil or floor is missing\n  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin xmax ymax zmax"
        ;
        uVar5 = 0xd1b;
        goto LAB_0019315f;
      }
      dVar14 = atof(args[(long)iVar9 + 3]);
      dVar15 = atof(args[(long)iVar9 + 4]);
      for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
        dVar16 = atof(args[(iVar9 + 5) + lVar6]);
        geom[lVar6] = dVar16;
      }
      dVar16 = (double)(~-(ulong)(0.0 < dVar14) & (ulong)-dVar14 |
                       -(ulong)(0.0 < dVar14) & (ulong)dVar14);
      iVar10 = ref_grid->mpi->id;
      if (local_108._0_4_ == 0) {
        if (iVar10 == 0) {
          pcVar8 = "--uniform box ceil h0=%f decay=%f [%f %f %f %f %f %f]\n";
          goto LAB_00192da3;
        }
      }
      else if (iVar10 == 0) {
        pcVar8 = "--uniform box floor h0=%f decay=%f [%f %f %f %f %f %f]\n";
LAB_00192da3:
        printf(pcVar8,dVar16,dVar15,geom[0],geom[1],geom[2],geom[3],geom[4],geom[5]);
      }
      dVar18 = dVar15 * 1e+20;
      if (dVar18 <= -dVar18) {
        dVar18 = -dVar18;
      }
      lVar11 = 0;
      for (lVar6 = 0; pRVar1 = ref_grid->node, dVar14 = in_XMM1_Qa, iVar10 = iVar9 + 0xb,
          lVar6 < pRVar1->max; lVar6 = lVar6 + 1) {
        if (-1 < pRVar1->global[lVar6]) {
          dVar14 = 0.0;
          for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
            dVar17 = *(double *)((long)pRVar1->real + lVar4 * 8 + lVar11);
            dVar20 = dVar17 - geom[lVar4 + 3];
            uVar12 = -(ulong)(geom[lVar4 + 3] < dVar17);
            dVar19 = dVar17 - geom[lVar4];
            uVar13 = -(ulong)(dVar17 < geom[lVar4]);
            dVar14 = (double)(~uVar13 & (ulong)dVar14 | (ulong)(dVar19 * dVar19 + dVar14) & uVar13);
            dVar14 = (double)(uVar12 & (ulong)(dVar20 * dVar20 + dVar14) | ~uVar12 & (ulong)dVar14);
          }
          if (dVar14 < 0.0) {
            in_XMM1_Qa = sqrt(dVar14);
          }
          else {
            in_XMM1_Qa = SQRT(dVar14);
          }
          dVar17 = -in_XMM1_Qa;
          dVar14 = dVar17;
          if (dVar17 <= in_XMM1_Qa) {
            dVar14 = in_XMM1_Qa;
          }
          dVar19 = dVar16;
          if (dVar14 < dVar18) {
            dVar19 = exp2(dVar17 / dVar15);
            dVar19 = dVar19 * dVar16;
          }
          pRVar7 = metric + lVar6 * 6;
          uVar3 = ref_matrix_diag_m(pRVar7,&local_a8);
          if (uVar3 != 0) {
            pcVar8 = "decomp";
            uVar5 = 0xd3b;
            goto LAB_001930b4;
          }
          dVar14 = 1.0 / (dVar19 * dVar19);
          if (local_108._0_4_ == 0) {
            dVar17 = dVar14;
            if (dVar14 <= local_a8) {
              dVar17 = local_a8;
            }
            dVar19 = dVar14;
            if (dVar14 <= local_a0) {
              dVar19 = local_a0;
            }
            local_a8 = dVar17;
            local_a0 = dVar19;
            if (dVar14 <= local_98) {
              dVar14 = local_98;
            }
          }
          else {
            dVar17 = dVar14;
            if (local_a8 <= dVar14) {
              dVar17 = local_a8;
            }
            dVar19 = dVar14;
            if (local_a0 <= dVar14) {
              dVar19 = local_a0;
            }
            local_a8 = dVar17;
            local_a0 = dVar19;
            if (local_98 <= dVar14) {
              dVar14 = local_98;
            }
          }
          local_98 = dVar14;
          uVar3 = ref_matrix_form_m(&local_a8,pRVar7);
          if (uVar3 != 0) {
            pcVar8 = "reform";
            uVar5 = 0xd4b;
            goto LAB_001930b4;
          }
          if (ref_grid->twod != 0) {
            pRVar7[2] = 0.0;
            pRVar7[4] = local_48;
            pRVar7[5] = RStack_40;
          }
        }
        lVar11 = lVar11 + 0x78;
      }
      goto LAB_00192929;
    }
    pcVar8 = 
    "not enough arguments for\n  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin xmax ymax zmax"
    ;
    uVar5 = 0xd16;
  }
LAB_0019315f:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar5,
         "ref_metric_parse",pcVar8);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_parse(REF_DBL *metric, REF_GRID ref_grid,
                                    int narg, char *args[]) {
  REF_INT i, node, pos;
  REF_DBL diag_system[12];
  REF_DBL h0, decay_distance;
  REF_DBL geom[8];
  REF_DBL r, h;
  REF_BOOL ceil;

  pos = 0;
  while (pos < narg) {
    if (strncmp(args[pos], "--uniform", 9) != 0) {
      pos++;
    } else {
      pos++;
      if (pos < narg && strncmp(args[pos], "box", 3) == 0) {
        pos++;
        RAS(pos + 8 < narg,
            "not enough arguments for\n"
            "  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin "
            "xmax ymax zmax");
        RAS(strncmp(args[pos], "ceil", 4) == 0 ||
                strncmp(args[pos], "floor", 5) == 0,
            "ceil or floor is missing\n"
            "  --uniform box {ceil,floor} h0 decay_distance xmin ymin zmin "
            "xmax ymax zmax");
        ceil = (strncmp(args[pos], "ceil", 4) == 0);
        pos++;
        h0 = atof(args[pos]);
        pos++;
        decay_distance = atof(args[pos]);
        pos++;
        h0 = ABS(h0); /* metric must be semi-positive definite */
        for (i = 0; i < 6; i++) {
          geom[i] = atof(args[pos]);
          pos++;
        }

        if (ceil) {
          if (ref_mpi_once(ref_grid_mpi(ref_grid)))
            printf("--uniform box ceil h0=%f decay=%f [%f %f %f %f %f %f]\n",
                   h0, decay_distance, geom[0], geom[1], geom[2], geom[3],
                   geom[4], geom[5]);
        } else {
          if (ref_mpi_once(ref_grid_mpi(ref_grid)))
            printf("--uniform box floor h0=%f decay=%f [%f %f %f %f %f %f]\n",
                   h0, decay_distance, geom[0], geom[1], geom[2], geom[3],
                   geom[4], geom[5]);
        }
        each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
          RSS(ref_metric_cart_box_dist(
                  geom, ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &r),
              "box dist");
          h = h0;
          if (ref_math_divisible(-r, decay_distance)) {
            h = h0 * pow(2, -r / decay_distance);
          }
          RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
          if (ceil) {
            ref_matrix_eig(diag_system, 0) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          } else {
            ref_matrix_eig(diag_system, 0) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          }
          RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform");
          if (ref_grid_twod(ref_grid)) {
            metric[2 + 6 * node] = 0.0;
            metric[4 + 6 * node] = 0.0;
            metric[5 + 6 * node] = 1.0;
          }
        }
        continue;
      }
      if (pos < narg && strncmp(args[pos], "cyl", 3) == 0) {
        pos++;
        RAS(pos + 10 < narg,
            "not enough arguments for\n"
            "  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 "
            "x2 y2 z2 r1 r2");
        RAS(strncmp(args[pos], "ceil", 4) == 0 ||
                strncmp(args[pos], "floor", 5) == 0,
            "ceil or floor is missing\n"
            "  --uniform cyl {ceil,floor} h0 decay_distance x1 y1 z1 "
            "x2 y2 z2 r1 r2");
        ceil = (strncmp(args[pos], "ceil", 4) == 0);
        pos++;
        h0 = atof(args[pos]);
        pos++;
        decay_distance = atof(args[pos]);
        pos++;
        h0 = ABS(h0); /* metric must be semi-positive definite */
        for (i = 0; i < 8; i++) {
          geom[i] = atof(args[pos]);
          pos++;
        }
        each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
          RSS(ref_metric_truncated_cone_dist(
                  geom, ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &r),
              "trunc cone dist");
          h = h0;
          if (ref_math_divisible(-r, decay_distance)) {
            h = h0 * pow(2, -r / decay_distance);
          }
          RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "decomp");
          if (ceil) {
            ref_matrix_eig(diag_system, 0) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MAX(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          } else {
            ref_matrix_eig(diag_system, 0) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 0));
            ref_matrix_eig(diag_system, 1) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 1));
            ref_matrix_eig(diag_system, 2) =
                MIN(1.0 / (h * h), ref_matrix_eig(diag_system, 2));
          }
          RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform");
          if (ref_grid_twod(ref_grid)) {
            metric[2 + 6 * node] = 0.0;
            metric[4 + 6 * node] = 0.0;
            metric[5 + 6 * node] = 1.0;
          }
        }
        continue;
      }
    }
  }
  return REF_SUCCESS;
}